

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# traversal_algorithm.cpp
# Opt level: O0

void __thiscall
libtorrent::dht::traversal_algorithm::add_entry
          (traversal_algorithm *this,node_id *id,endpoint *addr,observer_flags_t flags)

{
  char cVar1;
  bool bVar2;
  uint_type uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  node *pnVar7;
  dht_observer *pdVar8;
  element_type *peVar9;
  undefined4 extraout_var;
  __shared_ptr_access<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_00;
  node_id *pnVar10;
  session_settings *this_01;
  undefined8 uVar11;
  undefined4 extraout_var_00;
  undefined8 uVar12;
  undefined4 extraout_var_01;
  size_type sVar13;
  char *pcVar14;
  dht_observer *pdVar15;
  address *addr_00;
  pair<std::_Rb_tree_const_iterator<unsigned_long>,_bool> pVar16;
  undefined1 auVar17 [16];
  span<const_char> in;
  span<const_char> in_00;
  span<const_char> in_01;
  undefined8 in_stack_fffffffffffffb78;
  undefined4 uVar18;
  byte local_382;
  char local_2e1;
  traversal_algorithm *local_2e0;
  traversal_algorithm *local_2d8;
  shared_ptr<libtorrent::dht::observer> *local_2d0;
  __normal_iterator<std::shared_ptr<libtorrent::dht::observer>_*,_std::vector<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>_>
  local_2c8;
  __normal_iterator<std::shared_ptr<libtorrent::dht::observer>_*,_std::vector<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>_>
  local_2c0;
  shared_ptr<libtorrent::dht::observer> *local_2b8;
  const_iterator local_2b0;
  string local_2a8;
  aux *local_288;
  char *local_280;
  string local_278;
  dht_observer *local_258;
  dht_observer *logger_1;
  string local_230;
  aux *local_210;
  char *local_208;
  string local_200;
  dht_observer *local_1e0;
  dht_observer *logger_2;
  undefined1 local_1d0;
  _Base_ptr local_1c8;
  undefined1 local_1c0;
  address local_1b8;
  undefined1 local_198 [12];
  uint32_t prefix4;
  undefined1 local_188;
  _Base_ptr local_180;
  undefined1 local_178;
  uint64_t local_170;
  uint64_t prefix6;
  const_iterator prefix_it;
  address_v6 local_140;
  undefined1 local_128 [8];
  bytes_type addr_bytes;
  bitfield_flag local_f1;
  traversal_algorithm *local_f0;
  shared_ptr<libtorrent::dht::observer> *local_e8;
  shared_ptr<libtorrent::dht::observer> *local_e0;
  __normal_iterator<std::shared_ptr<libtorrent::dht::observer>_*,_std::vector<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>_>
  local_d8;
  __normal_iterator<std::shared_ptr<libtorrent::dht::observer>_*,_std::vector<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>_>
  iter;
  __normal_iterator<std::shared_ptr<libtorrent::dht::observer>_*,_std::vector<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>_>
  local_c8;
  __normal_iterator<std::shared_ptr<libtorrent::dht::observer>_*,_std::vector<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>_>
  end;
  aux *local_a0;
  char *local_98;
  string local_90;
  dht_observer *local_70;
  dht_observer *logger;
  node_id local_60;
  bitfield_flag<unsigned_char,_libtorrent::dht::observer_flags_tag,_void> local_49;
  undefined4 local_48;
  undefined1 local_38 [8];
  observer_ptr o;
  endpoint *addr_local;
  node_id *id_local;
  traversal_algorithm *this_local;
  observer_flags_t flags_local;
  
  uVar18 = (undefined4)((ulong)in_stack_fffffffffffffb78 >> 0x20);
  if ((this->m_done & 1U) != 0) {
    return;
  }
  o.super___shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)addr;
  (*this->_vptr_traversal_algorithm[5])(local_38,this,addr,id);
  bVar2 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_38);
  if (!bVar2) {
    pnVar7 = get_node(this);
    pdVar8 = dht::node::observer(pnVar7);
    if (pdVar8 != (dht_observer *)0x0) {
      pnVar7 = get_node(this);
      pdVar8 = dht::node::observer(pnVar7);
      (*(pdVar8->super_dht_logger)._vptr_dht_logger[1])
                (pdVar8,4,"[%u] failed to allocate memory or observer. aborting!",(ulong)this->m_id)
      ;
    }
    (*this->_vptr_traversal_algorithm[4])();
    local_48 = 1;
    goto LAB_0084abb4;
  }
  local_49.m_val = flags.m_val;
  peVar9 = ::std::
           __shared_ptr_access<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_38);
  libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::dht::observer_flags_tag,_void>::
  operator|=(&peVar9->flags,local_49);
  bVar2 = digest32<160L>::is_all_zeros(id);
  if (bVar2) {
    peVar9 = ::std::
             __shared_ptr_access<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_38);
    generate_random_id();
    observer::set_id(peVar9,&local_60);
    logger._7_1_ = '\x04';
    peVar9 = ::std::
             __shared_ptr_access<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_38);
    libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::dht::observer_flags_tag,_void>::
    operator|=(&peVar9->flags,logger._7_1_);
    ::std::
    vector<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>
    ::push_back(&this->m_results,(value_type *)local_38);
    pnVar7 = get_node(this);
    local_70 = dht::node::observer(pnVar7);
    if ((local_70 != (dht_observer *)0x0) &&
       (uVar4 = (**(local_70->super_dht_logger)._vptr_dht_logger)(local_70,4), pdVar8 = local_70,
       (uVar4 & 1) != 0)) {
      uVar4 = this->m_id;
      pdVar15 = local_70;
      span<char_const>::span<libtorrent::digest32<160l>,char,void>((span<char_const> *)&local_a0,id)
      ;
      in.m_len = (difference_type)pdVar15;
      in.m_ptr = local_98;
      libtorrent::aux::to_hex_abi_cxx11_(&local_90,local_a0,in);
      auVar17 = ::std::__cxx11::string::c_str();
      libtorrent::aux::print_endpoint_abi_cxx11_
                ((string *)&end,
                 (aux *)o.super___shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi,auVar17._8_8_);
      uVar12 = ::std::__cxx11::string::c_str();
      iVar5 = distance_exp(&this->m_target,id);
      cVar1 = this->m_invoke_count;
      iVar6 = (*this->_vptr_traversal_algorithm[2])();
      (*(pdVar8->super_dht_logger)._vptr_dht_logger[1])
                (pdVar8,4,"[%u] ADD (no-id) id: %s addr: %s distance: %d invoke-count: %d type: %s",
                 (ulong)uVar4,auVar17._0_8_,uVar12,CONCAT44(uVar18,iVar5),(int)cVar1,
                 CONCAT44(extraout_var,iVar6));
      ::std::__cxx11::string::~string((string *)&end);
      ::std::__cxx11::string::~string((string *)&local_90);
    }
  }
  else {
    iter._M_current =
         (shared_ptr<libtorrent::dht::observer> *)
         ::std::
         vector<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>
         ::begin(&this->m_results);
    local_c8 = __gnu_cxx::
               __normal_iterator<std::shared_ptr<libtorrent::dht::observer>_*,_std::vector<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>_>
               ::operator+(&iter,(long)this->m_sorted_results);
    local_e0 = (shared_ptr<libtorrent::dht::observer> *)
               ::std::
               vector<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>
               ::begin(&this->m_results);
    local_e8 = local_c8._M_current;
    local_f0 = this;
    local_d8 = ::std::
               lower_bound<__gnu_cxx::__normal_iterator<std::shared_ptr<libtorrent::dht::observer>*,std::vector<std::shared_ptr<libtorrent::dht::observer>,std::allocator<std::shared_ptr<libtorrent::dht::observer>>>>,std::shared_ptr<libtorrent::dht::observer>,libtorrent::dht::traversal_algorithm::add_entry(libtorrent::digest32<160l>const&,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::dht::observer_flags_tag,void>)::__0>
                         ((__normal_iterator<std::shared_ptr<libtorrent::dht::observer>_*,_std::vector<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>_>
                           )local_e0,local_c8,(shared_ptr<libtorrent::dht::observer> *)local_38,
                          (anon_class_8_1_8991fb9c_for__M_comp)this);
    bVar2 = __gnu_cxx::operator==(&local_d8,&local_c8);
    if (!bVar2) {
      this_00 = (__shared_ptr_access<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)__gnu_cxx::
                   __normal_iterator<std::shared_ptr<libtorrent::dht::observer>_*,_std::vector<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>_>
                   ::operator*(&local_d8);
      peVar9 = ::std::
               __shared_ptr_access<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(this_00);
      pnVar10 = observer::id(peVar9);
      bVar2 = digest32<160L>::operator!=(pnVar10,id);
      if (!bVar2) goto LAB_0084aaab;
    }
    this_01 = dht::node::settings(this->m_node);
    bVar2 = libtorrent::aux::session_settings::get_bool(this_01,0x8047);
    local_382 = 0;
    if (bVar2) {
      local_f1 = (bitfield_flag)
                 libtorrent::flags::operator&
                           ((bitfield_flag<unsigned_char,_libtorrent::dht::observer_flags_tag,_void>
                            )flags.m_val,
                            (bitfield_flag<unsigned_char,_libtorrent::dht::observer_flags_tag,_void>
                            )0x2);
      bVar2 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_f1);
      local_382 = bVar2 ^ 0xff;
    }
    if ((local_382 & 1) != 0) {
      peVar9 = ::std::
               __shared_ptr_access<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_38);
      observer::target_addr((address *)(addr_bytes._M_elems + 8),peVar9);
      bVar2 = boost::asio::ip::address::is_v6((address *)(addr_bytes._M_elems + 8));
      if (bVar2) {
        peVar9 = ::std::
                 __shared_ptr_access<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_38);
        observer::target_addr((address *)&prefix_it,peVar9);
        boost::asio::ip::address::to_v6(&local_140,(address *)&prefix_it);
        _local_128 = boost::asio::ip::address_v6::to_bytes(&local_140);
        prefix6 = (uint64_t)
                  ::std::array<unsigned_char,_16UL>::cbegin((array<unsigned_char,_16UL> *)local_128)
        ;
        local_170 = libtorrent::aux::read_uint64<unsigned_char_const*>((uchar **)&prefix6);
        pVar16 = ::std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                 ::insert(&this->m_peer6_prefixes,&local_170);
        register0x00000000 = pVar16.first._M_node;
        local_188 = pVar16.second;
        local_178 = local_188;
        local_180 = (_Base_ptr)register0x00000000;
      }
      else {
        peVar9 = ::std::
                 __shared_ptr_access<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_38);
        observer::target_addr(&local_1b8,peVar9);
        boost::asio::ip::address::to_v4((address *)local_198);
        uVar3 = boost::asio::ip::address_v4::to_uint((address_v4 *)local_198);
        local_198._4_4_ = uVar3 & 0xffffff00;
        pVar16 = (pair<std::_Rb_tree_const_iterator<unsigned_long>,_bool>)
                 ::std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                 insert(&this->m_peer4_prefixes,(value_type_conflict1 *)(local_198 + 4));
        logger_2 = (dht_observer *)pVar16.first._M_node;
        local_1d0 = pVar16.second;
        local_1c8 = (_Base_ptr)logger_2;
        local_1c0 = local_1d0;
      }
      if (((undefined1  [16])pVar16 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        pnVar7 = get_node(this);
        local_1e0 = dht::node::observer(pnVar7);
        if ((local_1e0 != (dht_observer *)0x0) &&
           (uVar4 = (**(local_1e0->super_dht_logger)._vptr_dht_logger)(local_1e0,4),
           pdVar8 = local_1e0, (uVar4 & 1) != 0)) {
          uVar4 = this->m_id;
          pdVar15 = local_1e0;
          peVar9 = ::std::
                   __shared_ptr_access<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_38);
          pnVar10 = observer::id(peVar9);
          span<char_const>::span<libtorrent::digest32<160l>,char,void>
                    ((span<char_const> *)&local_210,pnVar10);
          in_00.m_len = (difference_type)pdVar15;
          in_00.m_ptr = local_208;
          libtorrent::aux::to_hex_abi_cxx11_(&local_200,local_210,in_00);
          uVar12 = ::std::__cxx11::string::c_str();
          peVar9 = ::std::
                   __shared_ptr_access<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_38);
          observer::target_addr((address *)&logger_1,peVar9);
          libtorrent::aux::print_address_abi_cxx11_(&local_230,(aux *)&logger_1,addr_00);
          uVar11 = ::std::__cxx11::string::c_str();
          iVar5 = (*this->_vptr_traversal_algorithm[2])();
          (*(pdVar8->super_dht_logger)._vptr_dht_logger[1])
                    (pdVar8,4,"[%u] traversal DUPLICATE node. id: %s addr: %s type: %s",(ulong)uVar4
                     ,uVar12,uVar11,CONCAT44(extraout_var_00,iVar5));
          ::std::__cxx11::string::~string((string *)&local_230);
          ::std::__cxx11::string::~string((string *)&local_200);
        }
        local_48 = 1;
        goto LAB_0084abb4;
      }
    }
    pnVar7 = get_node(this);
    local_258 = dht::node::observer(pnVar7);
    if ((local_258 != (dht_observer *)0x0) &&
       (uVar4 = (**(local_258->super_dht_logger)._vptr_dht_logger)(local_258,4), pdVar8 = local_258,
       (uVar4 & 1) != 0)) {
      uVar4 = this->m_id;
      pdVar15 = local_258;
      span<char_const>::span<libtorrent::digest32<160l>,char,void>
                ((span<char_const> *)&local_288,id);
      in_01.m_len = (difference_type)pdVar15;
      in_01.m_ptr = local_280;
      libtorrent::aux::to_hex_abi_cxx11_(&local_278,local_288,in_01);
      auVar17 = ::std::__cxx11::string::c_str();
      libtorrent::aux::print_endpoint_abi_cxx11_
                (&local_2a8,
                 (aux *)o.super___shared_ptr<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi,auVar17._8_8_);
      uVar12 = ::std::__cxx11::string::c_str();
      iVar5 = distance_exp(&this->m_target,id);
      cVar1 = this->m_invoke_count;
      iVar6 = (*this->_vptr_traversal_algorithm[2])();
      (*(pdVar8->super_dht_logger)._vptr_dht_logger[1])
                (pdVar8,4,"[%u] ADD id: %s addr: %s distance: %d invoke-count: %d type: %s",
                 (ulong)uVar4,auVar17._0_8_,uVar12,CONCAT44(uVar18,iVar5),(int)cVar1,
                 CONCAT44(extraout_var_01,iVar6));
      ::std::__cxx11::string::~string((string *)&local_2a8);
      ::std::__cxx11::string::~string((string *)&local_278);
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<libtorrent::dht::observer>const*,std::vector<std::shared_ptr<libtorrent::dht::observer>,std::allocator<std::shared_ptr<libtorrent::dht::observer>>>>
    ::__normal_iterator<std::shared_ptr<libtorrent::dht::observer>*>
              ((__normal_iterator<std::shared_ptr<libtorrent::dht::observer>const*,std::vector<std::shared_ptr<libtorrent::dht::observer>,std::allocator<std::shared_ptr<libtorrent::dht::observer>>>>
                *)&local_2b0,&local_d8);
    local_2b8 = (shared_ptr<libtorrent::dht::observer> *)
                ::std::
                vector<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>
                ::insert(&this->m_results,local_2b0,(value_type *)local_38);
    this->m_sorted_results = this->m_sorted_results + '\x01';
  }
LAB_0084aaab:
  sVar13 = ::std::
           vector<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>
           ::size(&this->m_results);
  if (100 < sVar13) {
    local_2c8._M_current =
         (shared_ptr<libtorrent::dht::observer> *)
         ::std::
         vector<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>
         ::begin(&this->m_results);
    local_2c0 = __gnu_cxx::
                __normal_iterator<std::shared_ptr<libtorrent::dht::observer>_*,_std::vector<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>_>
                ::operator+(&local_2c8,100);
    local_2d0 = (shared_ptr<libtorrent::dht::observer> *)
                ::std::
                vector<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>
                ::end(&this->m_results);
    local_2d8 = this;
    local_2e0 = (traversal_algorithm *)
                ::std::
                for_each<__gnu_cxx::__normal_iterator<std::shared_ptr<libtorrent::dht::observer>*,std::vector<std::shared_ptr<libtorrent::dht::observer>,std::allocator<std::shared_ptr<libtorrent::dht::observer>>>>,libtorrent::dht::traversal_algorithm::add_entry(libtorrent::digest32<160l>const&,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>const&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::dht::observer_flags_tag,void>)::__1>
                          (local_2c0,
                           (__normal_iterator<std::shared_ptr<libtorrent::dht::observer>_*,_std::vector<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>_>
                            )local_2d0,(anon_class_8_1_8991fb9c)this);
    ::std::
    vector<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>
    ::resize(&this->m_results,100);
    local_2e1 = 'd';
    pcVar14 = ::std::min<signed_char>(&local_2e1,&this->m_sorted_results);
    this->m_sorted_results = *pcVar14;
  }
  local_48 = 0;
LAB_0084abb4:
  ::std::shared_ptr<libtorrent::dht::observer>::~shared_ptr
            ((shared_ptr<libtorrent::dht::observer> *)local_38);
  return;
}

Assistant:

void traversal_algorithm::add_entry(node_id const& id
	, udp::endpoint const& addr, observer_flags_t const flags)
{
	INVARIANT_CHECK;
	if (m_done) return;

	TORRENT_ASSERT(m_node.m_rpc.allocation_size() >= sizeof(find_data_observer));
	auto o = new_observer(addr, id);
	if (!o)
	{
#ifndef TORRENT_DISABLE_LOGGING
		if (get_node().observer() != nullptr)
		{
			get_node().observer()->log(dht_logger::traversal, "[%u] failed to allocate memory or observer. aborting!"
				, m_id);
		}
#endif
		done();
		return;
	}

	o->flags |= flags;

	if (id.is_all_zeros())
	{
		o->set_id(generate_random_id());
		o->flags |= observer::flag_no_id;

		m_results.push_back(o);

#ifndef TORRENT_DISABLE_LOGGING
		dht_observer* logger = get_node().observer();
		if (logger != nullptr && logger->should_log(dht_logger::traversal))
		{
			logger->log(dht_logger::traversal
				, "[%u] ADD (no-id) id: %s addr: %s distance: %d invoke-count: %d type: %s"
				, m_id, aux::to_hex(id).c_str(), aux::print_endpoint(addr).c_str()
				, distance_exp(m_target, id), m_invoke_count, name());
		}
#endif
	}
	else
	{
		TORRENT_ASSERT(std::size_t(m_sorted_results) <= m_results.size());
		auto end = m_results.begin() + m_sorted_results;

		TORRENT_ASSERT(libtorrent::dht::is_sorted(m_results.begin(), end
				, [this](observer_ptr const& lhs, observer_ptr const& rhs)
				{ return compare_ref(lhs->id(), rhs->id(), m_target); }));

		auto iter = std::lower_bound(m_results.begin(), end, o
			, [this](observer_ptr const& lhs, observer_ptr const& rhs)
			{ return compare_ref(lhs->id(), rhs->id(), m_target); });

		if (iter == end || (*iter)->id() != id)
		{
			// this IP restriction does not apply to the nodes we loaded from out
			// node cache
			if (m_node.settings().get_bool(settings_pack::dht_restrict_search_ips)
				&& !(flags & observer::flag_initial))
			{
				if (o->target_addr().is_v6())
				{
					address_v6::bytes_type addr_bytes = o->target_addr().to_v6().to_bytes();
					auto prefix_it = addr_bytes.cbegin();
					std::uint64_t const prefix6 = aux::read_uint64(prefix_it);

					if (m_peer6_prefixes.insert(prefix6).second)
						goto add_result;
				}
				else
				{
					// mask the lower octet
					std::uint32_t const prefix4
						= o->target_addr().to_v4().to_uint() & 0xffffff00;

					if (m_peer4_prefixes.insert(prefix4).second)
						goto add_result;
				}

				// we already have a node in this search with an IP very
				// close to this one. We know that it's not the same, because
				// it claims a different node-ID. Ignore this to avoid attacks
#ifndef TORRENT_DISABLE_LOGGING
				dht_observer* logger = get_node().observer();
				if (logger != nullptr && logger->should_log(dht_logger::traversal))
				{
					logger->log(dht_logger::traversal
						, "[%u] traversal DUPLICATE node. id: %s addr: %s type: %s"
						, m_id, aux::to_hex(o->id()).c_str(), aux::print_address(o->target_addr()).c_str(), name());
				}
#endif
				return;
			}

	add_result:

			TORRENT_ASSERT((o->flags & observer::flag_no_id)
				|| std::none_of(m_results.begin(), end
					, [&id](observer_ptr const& ob) { return ob->id() == id; }));

#ifndef TORRENT_DISABLE_LOGGING
			dht_observer* logger = get_node().observer();
			if (logger != nullptr && logger->should_log(dht_logger::traversal))
			{
				logger->log(dht_logger::traversal
					, "[%u] ADD id: %s addr: %s distance: %d invoke-count: %d type: %s"
					, m_id, aux::to_hex(id).c_str(), aux::print_endpoint(addr).c_str()
					, distance_exp(m_target, id), m_invoke_count, name());
			}
#endif
			m_results.insert(iter, o);
			++m_sorted_results;
		}
	}

	TORRENT_ASSERT(std::size_t(m_sorted_results) <= m_results.size());
	TORRENT_ASSERT(libtorrent::dht::is_sorted(m_results.begin()
		, m_results.begin() + m_sorted_results
		, [this](observer_ptr const& lhs, observer_ptr const& rhs)
		{ return compare_ref(lhs->id(), rhs->id(), m_target); }));

	if (m_results.size() > 100)
	{
		std::for_each(m_results.begin() + 100, m_results.end()
			, [this](std::shared_ptr<observer> const& ptr)
		{
			if ((ptr->flags & (observer::flag_queried | observer::flag_failed | observer::flag_alive))
				== observer::flag_queried)
			{
				// set the done flag on any outstanding queries to prevent them from
				// calling finished() or failed()
				ptr->flags |= observer::flag_done;
				TORRENT_ASSERT(m_invoke_count > 0);
				--m_invoke_count;

				if (ptr->flags & observer::flag_short_timeout)
				{
					TORRENT_ASSERT(m_branch_factor > 0);
					--m_branch_factor;
				}
			}

#if TORRENT_USE_ASSERTS
			ptr->m_was_abandoned = true;
#endif
		});
		m_results.resize(100);
		m_sorted_results = std::min(std::int8_t(100), m_sorted_results);
	}
}